

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void anon_unknown.dwarf_14b954f::SpeakerDelegate::SDL_audio_callback
               (void *userdata,Uint8 *stream,int len)

{
  void *__src;
  int iVar1;
  void *pvVar2;
  size_t __n;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)((long)userdata + 0x10));
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  uVar5 = (ulong)(long)len >> 1;
  lVar3 = *(long *)((long)userdata + 0x40) - (long)*(void **)((long)userdata + 0x38);
  uVar4 = lVar3 >> 1;
  uVar6 = uVar5;
  if (uVar4 < uVar5) {
    uVar6 = uVar4;
  }
  memcpy(stream,*(void **)((long)userdata + 0x38),uVar6 * 2);
  if (uVar4 <= uVar5 && uVar5 - uVar4 != 0) {
    memset(stream + lVar3,0,(uVar5 - uVar4) * 2);
  }
  if (uVar6 != 0) {
    pvVar7 = *(void **)((long)userdata + 0x38);
    __src = (void *)((long)pvVar7 + uVar6 * 2);
    __n = *(long *)((long)userdata + 0x40) - (long)__src;
    pvVar2 = __src;
    if (__n != 0) {
      memmove(pvVar7,__src,__n);
      pvVar2 = *(void **)((long)userdata + 0x40);
    }
    pvVar7 = (void *)((long)pvVar7 + ((long)pvVar2 - (long)__src));
    if (pvVar2 != pvVar7) {
      *(void **)((long)userdata + 0x40) = pvVar7;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)((long)userdata + 0x10));
  return;
}

Assistant:

static void SDL_audio_callback(void *userdata, Uint8 *stream, int len) {
		reinterpret_cast<SpeakerDelegate *>(userdata)->audio_callback(stream, len);
	}